

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# texture.cpp
# Opt level: O1

ssize_t rw::Texture::read(int __fd,void *__buf,size_t __nbytes)

{
  TexDictionary *pTVar1;
  LLLink *pLVar2;
  TexDictionary *pTVar3;
  Texture *pTVar4;
  Raster *pRVar5;
  long lVar6;
  undefined4 in_register_0000003c;
  
  pTVar4 = (Texture *)(*(code *)findCB)();
  if (pTVar4 == (Texture *)0x0) {
    if ((*(int *)(engine + 0x10 + (long)textureModuleOffset) == 0) ||
       (pTVar4 = (Texture *)(*(code *)readCB)((char *)CONCAT44(in_register_0000003c,__fd),__buf),
       pTVar4 == (Texture *)0x0)) {
      if (*(int *)(engine + 0x14 + (long)textureModuleOffset) == 0) {
        pTVar4 = (Texture *)0x0;
      }
      else {
        pTVar4 = create((Raster *)0x0);
        if (pTVar4 == (Texture *)0x0) {
          return 0;
        }
        strncpy(pTVar4->name,(char *)CONCAT44(in_register_0000003c,__fd),0x20);
        if (__buf != (void *)0x0) {
          strncpy(pTVar4->mask,(char *)__buf,0x20);
        }
        pRVar5 = Raster::create(0,0,0,0x80,0);
        pTVar4->raster = pRVar5;
      }
    }
    if ((pTVar4 != (Texture *)0x0) &&
       (lVar6 = (long)textureModuleOffset, *(long *)(engine + 8 + lVar6) != 0)) {
      pTVar1 = pTVar4->dict;
      if (pTVar1 != (TexDictionary *)0x0) {
        pLVar2 = (pTVar4->inDict).prev;
        pLVar2->next = (pTVar4->inDict).next;
        ((pTVar4->inDict).next)->prev = pLVar2;
      }
      pTVar3 = *(TexDictionary **)(engine + 8 + lVar6);
      if (pTVar1 != (TexDictionary *)0x0) {
        pLVar2 = (pTVar4->inDict).prev;
        pLVar2->next = (pTVar4->inDict).next;
        ((pTVar4->inDict).next)->prev = pLVar2;
      }
      pTVar4->dict = pTVar3;
      (pTVar4->inDict).next = &(pTVar3->textures).link;
      (pTVar4->inDict).prev = (pTVar3->textures).link.prev;
      ((pTVar3->textures).link.prev)->next = &pTVar4->inDict;
      (pTVar3->textures).link.prev = &pTVar4->inDict;
    }
  }
  else {
    pTVar4->refCount = pTVar4->refCount + 1;
  }
  return (ssize_t)pTVar4;
}

Assistant:

Texture*
Texture::read(const char *name, const char *mask)
{
	(void)mask;
	Raster *raster = nil;
	Texture *tex;

	if(tex = Texture::findCB(name), tex){
		tex->addRef();
		return tex;
	}
	if(TEXTUREGLOBAL(loadTextures)){
		tex = Texture::readCB(name, mask);
		if(tex == nil)
			goto dummytex;
	}else dummytex: if(TEXTUREGLOBAL(makeDummies)){
//printf("missing texture %s %s\n", name ? name : "", mask ? mask : "");
		tex = Texture::create(nil);
		if(tex == nil)
			return nil;
		strncpy(tex->name, name, 32);
		if(mask)
			strncpy(tex->mask, mask, 32);
		raster = Raster::create(0, 0, 0, Raster::DONTALLOCATE);
		tex->raster = raster;
	}
	if(tex && TEXTUREGLOBAL(currentTexDict)){
		if(tex->dict)
			tex->inDict.remove();
		TEXTUREGLOBAL(currentTexDict)->add(tex);
	}
	return tex;
}